

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

KHashMapEntry * KHashMap_getentry(KonohaContext *kctx,KHashMap *kmap,kuint_t hcode)

{
  KHashMapEntry *e;
  size_t idx;
  KHashMapEntry **hlist;
  kuint_t hcode_local;
  KHashMap *kmap_local;
  KonohaContext *kctx_local;
  
  e = kmap->hentry[hcode % kmap->hmax];
  while( true ) {
    if (e == (KHashMapEntry *)0x0) {
      return (KHashMapEntry *)0x0;
    }
    if (e->hcode == hcode) break;
    e = e->next;
  }
  return e;
}

Assistant:

static KHashMapEntry *KHashMap_getentry(KonohaContext *kctx, KHashMap* kmap, kuint_t hcode)
{
	KHashMapEntry **hlist = kmap->hentry;
	size_t idx = hcode % kmap->hmax;
	KHashMapEntry *e = hlist[idx];
	while(e != NULL) {
		if(e->hcode == hcode) return e;
		e = e->next;
	}
	return NULL;
}